

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

iterator * __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::operator--
          (iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  (__return_storage_ptr__->super_const_iterator).map = (this->super_const_iterator).map;
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
            (&(__return_storage_ptr__->super_const_iterator).path.path,
             (Base *)&(this->super_const_iterator).path);
  const_iterator::operator--(&this->super_const_iterator);
  return __return_storage_ptr__;
}

Assistant:

iterator operator--(int) {
        iterator tmp(*this);
        --(*this);
        return tmp;
    }